

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::prepareTexture
          (TextureCubeMapArraySamplingTest *this,textureDefinition *texture,
          formatDefinition *texture_format,resolutionDefinition *resolution,bool mutability)

{
  byte bVar1;
  uint n_elements_00;
  int iVar2;
  GLenum err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  uint n_mipmap_levels_00;
  socklen_t __len;
  sockaddr *__addr;
  int local_60;
  int local_5c;
  GLint face;
  GLint element_index;
  GLint mipmap_level_1;
  GLint mipmap_level;
  Functions *gl;
  GLuint local_40;
  GLsizei texture_height;
  GLsizei texture_width;
  GLint n_mipmap_levels;
  GLint n_elements;
  bool mutability_local;
  resolutionDefinition *resolution_local;
  formatDefinition *texture_format_local;
  textureDefinition *texture_local;
  TextureCubeMapArraySamplingTest *this_local;
  Functions *gl_00;
  
  n_elements_00 = resolution->m_depth / 6;
  bVar1 = getMipmapLevelCount(resolution->m_width,resolution->m_height);
  __len = (socklen_t)bVar1;
  n_mipmap_levels_00 = (uint)bVar1;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  textureDefinition::bind(texture,0x9009,__addr,__len);
  if (mutability) {
    local_40 = resolution->m_width;
    gl._4_4_ = resolution->m_height;
    for (element_index = 0; element_index < (int)n_mipmap_levels_00;
        element_index = element_index + 1) {
      (*gl_00->texImage3D)
                (0x9009,element_index,(texture_format->m_source).m_internal_format,local_40,gl._4_4_
                 ,resolution->m_depth,0,(texture_format->m_source).m_format,
                 (texture_format->m_source).m_type,(void *)0x0);
      local_40 = de::max<int>(1,(int)local_40 / 2);
      gl._4_4_ = de::max<int>(1,(int)gl._4_4_ / 2);
    }
  }
  else {
    (*gl_00->texStorage3D)
              (0x9009,n_mipmap_levels_00,(texture_format->m_source).m_internal_format,
               resolution->m_width,resolution->m_height,resolution->m_depth);
  }
  err = (*gl_00->getError)();
  glu::checkError(err,"Failed to allocate storage for texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0xda0);
  local_40 = resolution->m_width;
  gl._4_4_ = resolution->m_height;
  for (face = 0; face < (int)n_mipmap_levels_00; face = face + 1) {
    for (local_5c = 0; local_5c < (int)n_elements_00; local_5c = local_5c + 1) {
      for (local_60 = 0; local_60 < 6; local_60 = local_60 + 1) {
        prepareTextureFace(gl_00,local_60,local_5c,face,n_elements_00,n_mipmap_levels_00,
                           (texture_format->m_source).m_format,(texture_format->m_source).m_type,
                           local_40,gl._4_4_);
      }
    }
    local_40 = de::max<int>(1,(int)local_40 / 2);
    gl._4_4_ = de::max<int>(1,(int)gl._4_4_ / 2);
  }
  if (((((texture_format->m_source).m_internal_format == 0x8d70) ||
       ((texture_format->m_source).m_internal_format == 0x8d82)) ||
      ((texture_format->m_source).m_internal_format == 0x8d48)) ||
     ((texture_format->m_source).m_internal_format == 0x8cac)) {
    (*gl_00->texParameteri)(0x9009,0x2800,0x2600);
    (*gl_00->texParameteri)(0x9009,0x2801,0x2700);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::prepareTexture(const textureDefinition&	texture,
													 const formatDefinition&	 texture_format,
													 const resolutionDefinition& resolution, bool mutability)
{
	static const glw::GLint n_faces = 6;

	const glw::GLint n_elements		 = resolution.m_depth / n_faces;
	const glw::GLint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	glw::GLsizei	 texture_width   = 0;
	glw::GLsizei	 texture_height  = 0;

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	texture.bind(GL_TEXTURE_CUBE_MAP_ARRAY);

	if (false == mutability)
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, n_mipmap_levels, texture_format.m_source.m_internal_format,
						resolution.m_width, resolution.m_height, resolution.m_depth);
	}
	else
	{
		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, texture_format.m_source.m_internal_format,
						  texture_width, texture_height, resolution.m_depth, 0 /* border */,
						  texture_format.m_source.m_format, texture_format.m_source.m_type, 0 /* data */);

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to allocate storage for texture");

	texture_width  = resolution.m_width;
	texture_height = resolution.m_height;

	for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
	{
		for (glw::GLint element_index = 0; element_index < n_elements; ++element_index)
		{
			for (glw::GLint face = 0; face < n_faces; ++face)
			{
				prepareTextureFace(gl, face, element_index, mipmap_level, n_elements, n_mipmap_levels,
								   texture_format.m_source.m_format, texture_format.m_source.m_type, texture_width,
								   texture_height);
			}
		}

		texture_width  = de::max(1, texture_width / 2);
		texture_height = de::max(1, texture_height / 2);
	}

	// not texture filterable formats
	if ((texture_format.m_source.m_internal_format == GL_RGBA32UI) ||
		(texture_format.m_source.m_internal_format == GL_RGBA32I) ||
		(texture_format.m_source.m_internal_format == GL_STENCIL_INDEX8) ||
		(texture_format.m_source.m_internal_format == GL_DEPTH_COMPONENT32F))
	{
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
	}
}